

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::ReportError_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,Nonnull<CordRep_*> root,
          Nonnull<CordRep_*> node)

{
  byte bVar1;
  ostream *poVar2;
  long lVar3;
  string *psVar4;
  char *pcVar5;
  ostream *in_R9;
  ulong uVar6;
  string_view src;
  string_view src_00;
  string_view label;
  ostringstream buf;
  undefined1 local_221 [17];
  Data local_210;
  long local_208;
  string *local_1d0;
  Data local_1c8;
  code *local_1c0;
  Data local_1b8;
  undefined8 local_1b0;
  long local_1a8 [2];
  ulong auStack_198 [12];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error at node ",0xe);
  poVar2 = std::ostream::_M_insert<void_const*>(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in:",4);
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
  if (this == (lts_20250127 *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 7;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
      std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(ulong *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
      if (bVar1 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SUBSTRING @ ",0xc);
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x01') {
LAB_00291e7a:
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x37b,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
        }
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        lVar3 = 0x18;
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x01') goto LAB_00291e7a;
      }
      else {
        if (bVar1 != 2) {
          if (bVar1 == 5) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"EXTERNAL [",10)
            ;
            if ((((CordRepBtree *)this)->super_CordRep).tag != '\x05') {
              __assert_fail("IsExternal()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0x385,"CordRepExternal *absl::cord_internal::CordRep::external()");
            }
            src._M_str = (char *)node;
            src._M_len = (size_t)((CordRepBtree *)this)->edges_[0];
            CEscape_abi_cxx11_((string *)(local_221 + 1),
                               (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_221._1_8_,
                       CONCAT71(local_221._10_7_,local_221[9]));
          }
          else {
            if (bVar1 < 6) {
              label._M_str = (char *)0x1;
              label._M_len = (size_t)"";
              cord_internal::CordRepBtree::Dump
                        ((CordRepBtree *)this,(CordRep *)0x0,label,SUB81(local_1a8,0),in_R9);
              goto LAB_00291e15;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FLAT cap=",9);
            bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
            if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
LAB_00291eb8:
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
            }
            poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," [",2);
            bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
            src_00._M_str._0_4_ = bVar1 - 0xf9;
            if (((uint)src_00._M_str < 7) || (bVar1 < 6)) goto LAB_00291eb8;
            src_00._M_len = (size_t)(((CordRepBtree *)this)->super_CordRep).storage;
            src_00._M_str._4_4_ = 0;
            CEscape_abi_cxx11_((string *)(local_221 + 1),
                               (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src_00
                              );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_221._1_8_,
                       CONCAT71(local_221._10_7_,local_221[9]));
          }
          if ((Data *)local_221._1_8_ != &local_210) {
            operator_delete((void *)local_221._1_8_,(ulong)(local_210.ptr + 1));
          }
          lVar3 = 2;
          pcVar5 = "]\n";
          goto LAB_00291e08;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CRC crc=",8);
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x02') {
LAB_00291e99:
          __assert_fail("IsCrc()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                        ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
        }
        local_1c8._0_4_ =
             crc_internal::CrcCordState::Checksum
                       ((CrcCordState *)(((CordRepBtree *)this)->edges_ + 1));
        local_1b8.ptr = "%08x";
        local_1b0 = 4;
        local_1c8._4_4_ = 0;
        local_1c0 = str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
        local_221._1_8_ = &local_1b8;
        node = (Nonnull<CordRep_*>)local_221;
        InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
        ::InlinedVector<const_absl::lts_20250127::str_format_internal::FormatArgImpl_*,_0>
                  ((InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                    *)((long)local_221 + 9),(FormatArgImpl *)&local_1c8,(FormatArgImpl *)&local_1b8,
                   (allocator_type *)node);
        poVar2 = str_format_internal::Streamable::Print
                           ((Streamable *)(local_221 + 1),(ostream *)local_1a8);
        if ((local_221[9] & 1) != 0) {
          operator_delete(local_210.ptr,local_208 << 4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        lVar3 = 0x10;
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x02') goto LAB_00291e99;
      }
      uVar6 = uVar6 + 1;
      this = *(lts_20250127 **)((((CordRepBtree *)this)->super_CordRep).storage + lVar3 + -0xd);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
    } while ((CordRepBtree *)this != (CordRepBtree *)0x0);
    uVar6 = uVar6 & 0xffffffff;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 7;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  *(ulong *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
  lVar3 = 5;
  pcVar5 = "NULL\n";
LAB_00291e08:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar3);
LAB_00291e15:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

static std::string ReportError(absl::Nonnull<CordRep*> root,
                               absl::Nonnull<CordRep*> node) {
  std::ostringstream buf;
  buf << "Error at node " << node << " in:";
  DumpNode(root, true, &buf);
  return buf.str();
}